

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLNodeLoader.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::NodeLoader::begin__lookat(NodeLoader *this,lookat__AttributeData *attributeData)

{
  bool bVar1;
  char *in_RDI;
  NodeLoader *unaff_retaddr;
  
  bVar1 = beginTransformation<COLLADAFW::Lookat>(unaff_retaddr,in_RDI);
  return bVar1;
}

Assistant:

bool NodeLoader::begin__lookat ( const lookat__AttributeData& attributeData )
	{
		return beginTransformation<COLLADAFW::Lookat>( attributeData.sid );
	}